

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# late_materialization.cpp
# Opt level: O1

ColumnBinding __thiscall
duckdb::LateMaterialization::ConstructRHS
          (LateMaterialization *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  LogicalOperator *this_00;
  iterator __position;
  ColumnBinding CVar1;
  int iVar2;
  pointer pLVar3;
  reference pvVar4;
  LogicalGet *get;
  vector<duckdb::ColumnIndex,_true> *pvVar5;
  reference pvVar6;
  LogicalFilter *pLVar7;
  LogicalProjection *pLVar8;
  InternalException *this_01;
  sbyte sVar9;
  pointer pCVar10;
  pointer *__ptr;
  pointer pCVar11;
  long lVar12;
  size_type __n;
  reference<LogicalOperator> child;
  vector<std::reference_wrapper<duckdb::LogicalOperator>,_true> stack;
  long *local_88;
  reference_wrapper<duckdb::LogicalOperator> local_80;
  vector<std::reference_wrapper<duckdb::LogicalOperator>,_true> local_78;
  ColumnBinding local_60;
  string local_50;
  
  local_78.
  super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (reference_wrapper<duckdb::LogicalOperator> *)0x0;
  local_78.
  super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (reference_wrapper<duckdb::LogicalOperator> *)0x0;
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(op);
  pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](&pLVar3->children,0);
  local_80._M_data =
       unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
       operator*(pvVar4);
  while ((local_80._M_data)->type != LOGICAL_GET) {
    if (local_78.
        super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_78.
        super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::
      vector<std::reference_wrapper<duckdb::LogicalOperator>,std::allocator<std::reference_wrapper<duckdb::LogicalOperator>>>
      ::_M_realloc_insert<std::reference_wrapper<duckdb::LogicalOperator>const&>
                ((vector<std::reference_wrapper<duckdb::LogicalOperator>,std::allocator<std::reference_wrapper<duckdb::LogicalOperator>>>
                  *)&local_78,
                 (iterator)
                 local_78.
                 super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                 .
                 super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_80);
    }
    else {
      (local_78.
       super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->_M_data = local_80._M_data;
      local_78.
      super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_78.
           super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::operator[](&(local_80._M_data)->children,0);
    local_80._M_data =
         unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
         operator*(pvVar4);
  }
  get = LogicalOperator::Cast<duckdb::LogicalGet>(local_80._M_data);
  local_60.column_index = GetOrInsertRowId(this,get);
  pCVar10 = (pointer)(get->projection_ids).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
  pCVar11 = (pointer)(get->projection_ids).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
  sVar9 = 3;
  if (pCVar10 == pCVar11) {
    pvVar5 = LogicalGet::GetColumnIds(get);
    pCVar10 = (pvVar5->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
              super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar11 = (pvVar5->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
              super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
              super__Vector_impl_data._M_finish;
    sVar9 = 5;
  }
  local_60.table_index = get->table_index;
  if ((long)local_78.
            super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_78.
            super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
            .
            super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    lVar12 = (long)pCVar11 - (long)pCVar10 >> sVar9;
    __n = (long)local_78.
                super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_78.
                super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
    do {
      __n = __n - 1;
      pvVar6 = vector<std::reference_wrapper<duckdb::LogicalOperator>,_true>::operator[]
                         (&local_78,__n);
      this_00 = pvVar6->_M_data;
      if (this_00->type == LOGICAL_PROJECTION) {
        pLVar8 = LogicalOperator::Cast<duckdb::LogicalProjection>(this_00);
        make_uniq<duckdb::BoundColumnRefExpression,char_const(&)[6],duckdb::LogicalType&,duckdb::ColumnBinding&>
                  ((duckdb *)&local_88,(char (*) [6])0x1e25a1b,&this->row_id_type,&local_60);
        local_50._M_dataplus._M_p = (pointer)local_88;
        local_88 = (long *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&(pLVar8->super_LogicalOperator).expressions,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_50);
        if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
        }
        local_50._M_dataplus._M_p = (pointer)0x0;
        if (local_88 != (long *)0x0) {
          (**(code **)(*local_88 + 8))();
        }
        local_60.table_index = pLVar8->table_index;
        lVar12 = (long)(pLVar8->super_LogicalOperator).expressions.
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pLVar8->super_LogicalOperator).expressions.
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
        local_60.column_index = lVar12 - 1;
      }
      else {
        if (this_00->type != LOGICAL_FILTER) {
          this_01 = (InternalException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,
                     "Unsupported logical operator in LateMaterialization::ConstructRHS","");
          InternalException::InternalException(this_01,&local_50);
          __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pLVar7 = LogicalOperator::Cast<duckdb::LogicalFilter>(this_00);
        iVar2 = (*(pLVar7->super_LogicalOperator)._vptr_LogicalOperator[0xc])(pLVar7);
        if ((char)iVar2 != '\0') {
          local_50._M_dataplus._M_p = (pointer)(lVar12 - 1);
          __position._M_current =
               (pLVar7->projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (pLVar7->projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &pLVar7->projection_map,__position,(unsigned_long *)&local_50);
          }
          else {
            *__position._M_current = (unsigned_long)local_50._M_dataplus._M_p;
            (pLVar7->projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
      }
    } while (__n != 0);
  }
  if (local_78.
      super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  CVar1.column_index = local_60.column_index;
  CVar1.table_index = local_60.table_index;
  return CVar1;
}

Assistant:

ColumnBinding LateMaterialization::ConstructRHS(unique_ptr<LogicalOperator> &op) {
	// traverse down until we reach the LogicalGet
	vector<reference<LogicalOperator>> stack;
	reference<LogicalOperator> child = *op->children[0];
	while (child.get().type != LogicalOperatorType::LOGICAL_GET) {
		stack.push_back(child);
		D_ASSERT(child.get().children.size() == 1);
		child = *child.get().children[0];
	}
	// we have reached the logical get - now we need to push the row-id column (if it is not yet projected out)
	auto &get = child.get().Cast<LogicalGet>();
	auto row_id_idx = GetOrInsertRowId(get);
	idx_t column_count = get.projection_ids.empty() ? get.GetColumnIds().size() : get.projection_ids.size();
	D_ASSERT(column_count == get.GetColumnBindings().size());

	// the row id has been projected - now project it up the stack
	ColumnBinding row_id_binding(get.table_index, row_id_idx);
	for (idx_t i = stack.size(); i > 0; i--) {
		auto &op = stack[i - 1].get();
		switch (op.type) {
		case LogicalOperatorType::LOGICAL_PROJECTION: {
			auto &proj = op.Cast<LogicalProjection>();
			// push a projection of the row-id column
			proj.expressions.push_back(make_uniq<BoundColumnRefExpression>("rowid", row_id_type, row_id_binding));
			// modify the row-id-binding to push to the new projection
			row_id_binding = ColumnBinding(proj.table_index, proj.expressions.size() - 1);
			column_count = proj.expressions.size();
			break;
		}
		case LogicalOperatorType::LOGICAL_FILTER: {
			auto &filter = op.Cast<LogicalFilter>();
			// column bindings pass-through this operator as-is UNLESS the filter has a projection map
			if (filter.HasProjectionMap()) {
				// if the filter has a projection map, we need to project the new column
				filter.projection_map.push_back(column_count - 1);
			}
			break;
		}
		default:
			throw InternalException("Unsupported logical operator in LateMaterialization::ConstructRHS");
		}
	}
	return row_id_binding;
}